

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_145302::MkdirCommand::isResultValid
          (MkdirCommand *this,BuildSystem *system,BuildValue *value)

{
  BuildNode *this_00;
  bool bVar1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_01;
  const_reference ppBVar2;
  FileSystem *fileSystem;
  undefined1 local_78 [8];
  FileInfo info;
  BuildValue *value_local;
  BuildSystem *system_local;
  MkdirCommand *this_local;
  
  info.checksum.bytes._24_8_ = value;
  bVar1 = llbuild::buildsystem::BuildValue::isSuccessfulCommand(value);
  if (bVar1) {
    this_01 = llbuild::buildsystem::Command::getOutputs((Command *)this);
    ppBVar2 = std::
              vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ::operator[](this_01,0);
    this_00 = *ppBVar2;
    fileSystem = llbuild::buildsystem::BuildSystem::getFileSystem(system);
    llbuild::buildsystem::BuildNode::getFileInfo((FileInfo *)local_78,this_00,fileSystem);
    bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_78);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = llbuild::basic::FileInfo::isDirectory((FileInfo *)local_78);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool isResultValid(BuildSystem& system,
                             const BuildValue& value) override {
    // If the prior value wasn't for a successful command, recompute.
    if (!value.isSuccessfulCommand())
      return false;

    // Otherwise, the result is valid if the directory still exists.
    auto info = getOutputs()[0]->getFileInfo(
        system.getFileSystem());
    if (info.isMissing())
      return false;

    // If the item is not a directory, it needs to be recreated.
    if (!info.isDirectory())
      return false;

    // FIXME: We should strictly enforce the integrity of this validity routine
    // by ensuring that the build result for this command does not fully encode
    // the file info, but rather just encodes its success. As is, we are leaking
    // out the details of the file info (like the timestamp), but not rerunning
    // when they change. This is by design for this command, but it would still
    // be nice to be strict about it.
    
    return true;
  }